

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int selectWindowRewriteExprCb(Walker *pWalker,Expr *pExpr)

{
  int iVar1;
  WindowRewrite *pWVar2;
  Parse *pParse_00;
  Expr *pExpr_00;
  ExprList *pEVar3;
  Expr *pDup;
  Window *pWin;
  int i;
  int nSrc;
  Parse *pParse;
  WindowRewrite *p;
  Expr *pExpr_local;
  Walker *pWalker_local;
  
  pWVar2 = (pWalker->u).pRewrite;
  pParse_00 = pWalker->pParse;
  if (pWVar2->pSubSelect != (Select *)0x0) {
    if (pExpr->op != 0xa2) {
      return 0;
    }
    iVar1 = pWVar2->pSrc->nSrc;
    pWin._0_4_ = 0;
    while (((int)pWin < iVar1 && (pExpr->iTable != pWVar2->pSrc->a[(int)pWin].iCursor))) {
      pWin._0_4_ = (int)pWin + 1;
    }
    if ((int)pWin == iVar1) {
      return 0;
    }
  }
  if (pExpr->op == 0xa1) {
    if ((pExpr->flags & 0x1000000) == 0) {
      return 0;
    }
    for (pDup = (Expr *)pWVar2->pWin; pDup != (Expr *)0x0; pDup = (Expr *)pDup->pAggInfo) {
      if ((pExpr->y).pTab == (Table *)pDup) {
        return 1;
      }
    }
  }
  else if (1 < pExpr->op - 0xa2) {
    return 0;
  }
  pExpr_00 = sqlite3ExprDup(pParse_00->db,pExpr,0);
  pEVar3 = sqlite3ExprListAppend(pParse_00,pWVar2->pSub,pExpr_00);
  pWVar2->pSub = pEVar3;
  if (pWVar2->pSub != (ExprList *)0x0) {
    pExpr->flags = pExpr->flags | 0x8000000;
    sqlite3ExprDelete(pParse_00->db,pExpr);
    pExpr->flags = pExpr->flags & 0xf7ffffff;
    memset(pExpr,0,0x48);
    pExpr->op = 0xa2;
    pExpr->iColumn = (short)pWVar2->pSub->nExpr + -1;
    pExpr->iTable = pWVar2->pWin->iEphCsr;
  }
  return 0;
}

Assistant:

static int selectWindowRewriteExprCb(Walker *pWalker, Expr *pExpr){
  struct WindowRewrite *p = pWalker->u.pRewrite;
  Parse *pParse = pWalker->pParse;

  /* If this function is being called from within a scalar sub-select
  ** that used by the SELECT statement being processed, only process
  ** TK_COLUMN expressions that refer to it (the outer SELECT). Do
  ** not process aggregates or window functions at all, as they belong
  ** to the scalar sub-select.  */
  if( p->pSubSelect ){
    if( pExpr->op!=TK_COLUMN ){
      return WRC_Continue;
    }else{
      int nSrc = p->pSrc->nSrc;
      int i;
      for(i=0; i<nSrc; i++){
        if( pExpr->iTable==p->pSrc->a[i].iCursor ) break;
      }
      if( i==nSrc ) return WRC_Continue;
    }
  }

  switch( pExpr->op ){

    case TK_FUNCTION:
      if( !ExprHasProperty(pExpr, EP_WinFunc) ){
        break;
      }else{
        Window *pWin;
        for(pWin=p->pWin; pWin; pWin=pWin->pNextWin){
          if( pExpr->y.pWin==pWin ){
            assert( pWin->pOwner==pExpr );
            return WRC_Prune;
          }
        }
      }
      /* Fall through.  */

    case TK_AGG_FUNCTION:
    case TK_COLUMN: {
      Expr *pDup = sqlite3ExprDup(pParse->db, pExpr, 0);
      p->pSub = sqlite3ExprListAppend(pParse, p->pSub, pDup);
      if( p->pSub ){
        assert( ExprHasProperty(pExpr, EP_Static)==0 );
        ExprSetProperty(pExpr, EP_Static);
        sqlite3ExprDelete(pParse->db, pExpr);
        ExprClearProperty(pExpr, EP_Static);
        memset(pExpr, 0, sizeof(Expr));

        pExpr->op = TK_COLUMN;
        pExpr->iColumn = p->pSub->nExpr-1;
        pExpr->iTable = p->pWin->iEphCsr;
      }

      break;
    }

    default: /* no-op */
      break;
  }

  return WRC_Continue;
}